

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

RC __thiscall
QO_Manager::ApplyEQCond
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attr_stats,int condIdx,float *numTuples)

{
  RC RVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  key_type *__k;
  QO_Manager *this_00;
  float fVar4;
  float fVar5;
  float frac;
  int attrIdx;
  int attrIdx2;
  float value;
  int local_3c;
  int local_38;
  float local_34;
  
  RVar1 = CondToAttrIdx(this,condIdx,&local_3c,&local_38);
  if (RVar1 == 0) {
    if (this->conds[condIdx].bRhsIsAttr == 0) {
      ConvertValueToFloat(this,condIdx,&local_34);
      fVar5 = *numTuples;
      __k = &local_3c;
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,__k);
      fVar5 = ceilf(fVar5 / pmVar2->numTuples);
      *numTuples = fVar5;
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,__k);
      pmVar2->numTuples = 1.0;
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,__k);
      pmVar2->minValue = local_34;
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,__k);
      pmVar2->maxValue = local_34;
    }
    else {
      fVar5 = *numTuples;
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      __k = &local_38;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,__k);
      fVar4 = pmVar3->numTuples;
      if (pmVar3->numTuples <= pmVar2->numTuples) {
        fVar4 = pmVar2->numTuples;
      }
      *numTuples = fVar5 / fVar4;
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,__k);
      fVar5 = pmVar3->numTuples;
      if (pmVar3->numTuples <= pmVar2->numTuples) {
        fVar5 = pmVar2->numTuples;
      }
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar2->numTuples = fVar5;
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_3c);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,__k);
      fVar5 = pmVar3->numTuples;
      if (pmVar3->numTuples <= pmVar2->numTuples) {
        fVar5 = pmVar2->numTuples;
      }
      pmVar2 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,__k);
      pmVar2->numTuples = fVar5;
      std::map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>::
      operator[](attr_stats,&local_3c);
    }
    this_00 = (QO_Manager *)attr_stats;
    std::map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>::
    operator[](attr_stats,__k);
    NormalizeStats(this_00,attr_stats,frac,*numTuples,local_3c,local_38);
  }
  return RVar1;
}

Assistant:

RC QO_Manager::ApplyEQCond(map<int, attrStat> &attr_stats, int condIdx, float& numTuples){
  RC rc = 0;
  // Retrieves the indices of the condition attributes
  int attrIdx, attrIdx2;
  if((rc = CondToAttrIdx(condIdx, attrIdx, attrIdx2)))
    return (rc);
  float frac = 0.0;
  if(conds[condIdx].bRhsIsAttr){
    // assume containment of value sets
    numTuples = numTuples / max(attr_stats[attrIdx].numTuples, attr_stats[attrIdx2].numTuples);
    attr_stats[attrIdx].numTuples = max(attr_stats[attrIdx].numTuples, attr_stats[attrIdx2].numTuples);
    attr_stats[attrIdx2].numTuples = max(attr_stats[attrIdx].numTuples, attr_stats[attrIdx2].numTuples);
    frac = 1.0/max(attr_stats[attrIdx].numTuples, attr_stats[attrIdx2].numTuples);
  }
  else{
    // calculate the # of tuples
    float value;
    ConvertValueToFloat(condIdx, value);
    numTuples = ceilf(numTuples / attr_stats[attrIdx].numTuples);
    attr_stats[attrIdx].numTuples = 1;
    attr_stats[attrIdx].minValue = value;
    attr_stats[attrIdx].maxValue = value;
    frac = 1.0/attr_stats[attrIdx].numTuples;
  }
  // Normalize non-join attributes
  NormalizeStats(attr_stats, frac, numTuples, attrIdx, attrIdx2);
  return (0);
}